

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

idx_t __thiscall duckdb::ZSTDCompressionState::NewSegment(ZSTDCompressionState *this)

{
  BufferHandle *this_00;
  pointer pCVar1;
  RowGroup *pRVar2;
  page_id_t *ppVar3;
  data_ptr_t pdVar4;
  InternalException *this_01;
  ulong uVar5;
  idx_t iVar6;
  allocator local_51;
  string local_50;
  
  this_00 = &this->segment_handle;
  if ((this->current_buffer).ptr != this_00) {
    if ((this->segment).
        super_unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>._M_t.
        super___uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
        .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl == (ColumnSegment *)0x0)
    {
      pRVar2 = ColumnDataCheckpointData::GetRowGroup(this->checkpoint_data);
      iVar6 = (pRVar2->super_SegmentBase<duckdb::RowGroup>).start;
    }
    else {
      pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->segment);
      iVar6 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).start;
      pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
               operator->(&this->segment);
      iVar6 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i + iVar6;
      FlushSegment(this);
    }
    CreateEmptySegment(this,iVar6);
    if (this->segment_count + 1 < this->total_segment_count) {
      iVar6 = this->vectors_per_segment;
    }
    else {
      iVar6 = this->total_vector_count - this->vector_count;
    }
    ppVar3 = (page_id_t *)BufferHandle::Ptr(this_00);
    this->page_ids = ppVar3;
    pdVar4 = BufferHandle::Ptr(this_00);
    this->page_offsets = (page_offset_t *)(pdVar4 + iVar6 * 8);
    pdVar4 = BufferHandle::Ptr(this_00);
    this->uncompressed_sizes =
         (uncompressed_size_t *)(pdVar4 + (iVar6 * 0xc + 7 & 0xfffffffffffffff8));
    uVar5 = iVar6 * 0x14 + 7 & 0xfffffffffffffff8;
    pdVar4 = BufferHandle::Ptr(this_00);
    this->compressed_sizes = (compressed_size_t *)(pdVar4 + uVar5);
    return uVar5 + iVar6 * 8;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "We are asking for a new segment, but somehow we\'re still writing vector data onto the initial (segment) page"
             ,&local_51);
  InternalException::InternalException(this_01,&local_50);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

idx_t NewSegment() {
		if (current_buffer == &segment_handle) {
			// This should never happen, the string lengths + vector metadata size should always exceed a page size,
			// even if the strings are all empty
			throw InternalException("We are asking for a new segment, but somehow we're still writing vector data onto "
			                        "the initial (segment) page");
		}
		idx_t row_start;
		if (segment) {
			row_start = segment->start + segment->count;
			FlushSegment();
		} else {
			row_start = checkpoint_data.GetRowGroup().start;
		}
		CreateEmptySegment(row_start);

		// Figure out how many vectors we are storing in this segment
		idx_t vectors_in_segment;
		if (segment_count + 1 >= total_segment_count) {
			vectors_in_segment = total_vector_count - vector_count;
		} else {
			vectors_in_segment = vectors_per_segment;
		}

		idx_t offset = 0;
		page_ids = reinterpret_cast<page_id_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_id_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(page_offset_t)>(offset);
		page_offsets = reinterpret_cast<page_offset_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(page_offset_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(uncompressed_size_t)>(offset);
		uncompressed_sizes = reinterpret_cast<uncompressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(uncompressed_size_t) * vectors_in_segment);

		offset = AlignValue<idx_t, sizeof(compressed_size_t)>(offset);
		compressed_sizes = reinterpret_cast<compressed_size_t *>(segment_handle.Ptr() + offset);
		offset += (sizeof(compressed_size_t) * vectors_in_segment);

		D_ASSERT(offset == GetVectorMetadataSize(vectors_in_segment));
		return offset;
	}